

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::texparameterf(NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  bool bVar2;
  ContextType ctxType;
  ApiType requiredApiType;
  RenderContext *pRVar3;
  ContextInfo *pCVar4;
  allocator<char> local_121;
  string local_120;
  deUint32 local_fc;
  ContextType local_f8;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  deUint32 local_a4;
  ContextType local_a0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  GLfloat local_18;
  GLuint local_14;
  GLfloat textureMode;
  GLuint texture;
  NegativeTestContext *ctx_local;
  
  local_14 = 0x1234;
  local_18 = -1.0;
  _textureMode = ctx;
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,1,&local_14);
  glu::CallLogWrapper::glBindTexture(&_textureMode->super_CallLogWrapper,0xde1,local_14);
  pNVar1 = _textureMode;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_ENUM is generated if target or pname is not one of the accepted defined values."
             ,&local_39);
  NegativeTestContext::beginSection(pNVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0,0x2801,9729.0);
  NegativeTestContext::expectError(_textureMode,0x500);
  glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0xde1,0,9729.0);
  NegativeTestContext::expectError(_textureMode,0x500);
  glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0,0,9729.0);
  NegativeTestContext::expectError(_textureMode,0x500);
  NegativeTestContext::endSection(_textureMode);
  pNVar1 = _textureMode;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "GL_INVALID_ENUM is generated if pname is enum and the value of param(s) is not a valid value."
             ,&local_71);
  NegativeTestContext::beginSection(pNVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0xde1,0x90ea,local_18);
  NegativeTestContext::expectError(_textureMode,0x500);
  glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0xde1,0x884c,local_18);
  NegativeTestContext::expectError(_textureMode,0x500);
  glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0xde1,0x884d,local_18);
  NegativeTestContext::expectError(_textureMode,0x500);
  glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0xde1,0x2800,local_18);
  NegativeTestContext::expectError(_textureMode,0x500);
  glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0xde1,0x2801,local_18);
  NegativeTestContext::expectError(_textureMode,0x500);
  glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0xde1,0x8e42,local_18);
  NegativeTestContext::expectError(_textureMode,0x500);
  glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0xde1,0x8e43,local_18);
  NegativeTestContext::expectError(_textureMode,0x500);
  glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0xde1,0x8e44,local_18);
  NegativeTestContext::expectError(_textureMode,0x500);
  glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0xde1,0x8e45,local_18);
  NegativeTestContext::expectError(_textureMode,0x500);
  glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0xde1,0x2802,local_18);
  NegativeTestContext::expectError(_textureMode,0x500);
  glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0xde1,0x2803,local_18);
  NegativeTestContext::expectError(_textureMode,0x500);
  glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0xde1,0x8072,local_18);
  NegativeTestContext::expectError(_textureMode,0x500);
  NegativeTestContext::endSection(_textureMode);
  pNVar1 = _textureMode;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,
             "GL_INVALID_VALUE is generated if pname is GL_TEXTURE_BASE_LEVEL or GL_TEXTURE_MAX_LEVEL and param(s) is negative."
             ,&local_99);
  NegativeTestContext::beginSection(pNVar1,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0xde1,0x813c,-1.0);
  NegativeTestContext::expectError(_textureMode,0x501);
  glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0xde1,0x813d,-1.0);
  NegativeTestContext::expectError(_textureMode,0x501);
  NegativeTestContext::endSection(_textureMode);
  pRVar3 = NegativeTestContext::getRenderContext(_textureMode);
  local_a0.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  local_a4 = (deUint32)glu::ApiType::es(3,2);
  bVar2 = glu::contextSupports(local_a0,(ApiType)local_a4);
  pNVar1 = _textureMode;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,
               "GL_INVALID_ENUM is generated if pname is a non-scalar parameter.",&local_c9);
    NegativeTestContext::beginSection(pNVar1,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0xde1,0x1004,0.0);
    NegativeTestContext::expectError(_textureMode,0x500);
    NegativeTestContext::endSection(_textureMode);
  }
  pNVar1 = _textureMode;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,
             "GL_INVALID_ENUM error is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname is not valid."
             ,&local_f1);
  NegativeTestContext::beginSection(pNVar1,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0x9100,0x1004,local_18);
  NegativeTestContext::expectError(_textureMode,0x500);
  glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0x9100,0x2801,local_18);
  NegativeTestContext::expectError(_textureMode,0x500);
  glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0x9100,0x2800,local_18);
  NegativeTestContext::expectError(_textureMode,0x500);
  glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0x9100,0x2802,local_18);
  NegativeTestContext::expectError(_textureMode,0x500);
  glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0x9100,0x2803,local_18);
  NegativeTestContext::expectError(_textureMode,0x500);
  glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0x9100,0x8072,local_18);
  NegativeTestContext::expectError(_textureMode,0x500);
  glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0x9100,0x813a,local_18);
  NegativeTestContext::expectError(_textureMode,0x500);
  glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0x9100,0x813b,local_18);
  NegativeTestContext::expectError(_textureMode,0x500);
  glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0x9100,0x884c,local_18);
  NegativeTestContext::expectError(_textureMode,0x500);
  glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0x9100,0x884d,local_18);
  NegativeTestContext::expectError(_textureMode,0x500);
  pRVar3 = NegativeTestContext::getRenderContext(_textureMode);
  local_f8.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  local_fc = (deUint32)glu::ApiType::es(3,2);
  bVar2 = glu::contextSupports(local_f8,(ApiType)local_fc);
  if (bVar2) {
LAB_022b9d21:
    glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0x9102,0x1004,local_18)
    ;
    NegativeTestContext::expectError(_textureMode,0x500);
    glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0x9102,0x2801,local_18)
    ;
    NegativeTestContext::expectError(_textureMode,0x500);
    glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0x9102,0x2800,local_18)
    ;
    NegativeTestContext::expectError(_textureMode,0x500);
    glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0x9102,0x2802,local_18)
    ;
    NegativeTestContext::expectError(_textureMode,0x500);
    glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0x9102,0x2803,local_18)
    ;
    NegativeTestContext::expectError(_textureMode,0x500);
    glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0x9102,0x8072,local_18)
    ;
    NegativeTestContext::expectError(_textureMode,0x500);
    glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0x9102,0x813a,local_18)
    ;
    NegativeTestContext::expectError(_textureMode,0x500);
    glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0x9102,0x813b,local_18)
    ;
    NegativeTestContext::expectError(_textureMode,0x500);
    glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0x9102,0x884c,local_18)
    ;
    NegativeTestContext::expectError(_textureMode,0x500);
    glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0x9102,0x884d,local_18)
    ;
    NegativeTestContext::expectError(_textureMode,0x500);
  }
  else {
    pCVar4 = NegativeTestContext::getContextInfo(_textureMode);
    bVar2 = glu::ContextInfo::isExtensionSupported
                      (pCVar4,"GL_OES_texture_storage_multisample_2d_array");
    if (bVar2) goto LAB_022b9d21;
  }
  NegativeTestContext::endSection(_textureMode);
  pNVar1 = _textureMode;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,
             "GL_INVALID_OPERATION is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname GL_TEXTURE_BASE_LEVEL is not 0."
             ,&local_121);
  NegativeTestContext::beginSection(pNVar1,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0x9100,0x813c,1.0);
  NegativeTestContext::expectError(_textureMode,0x502);
  pRVar3 = NegativeTestContext::getRenderContext(_textureMode);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar2 = glu::contextSupports(ctxType,requiredApiType);
  if (!bVar2) {
    pCVar4 = NegativeTestContext::getContextInfo(_textureMode);
    bVar2 = glu::ContextInfo::isExtensionSupported
                      (pCVar4,"GL_OES_texture_storage_multisample_2d_array");
    if (!bVar2) goto LAB_022ba02e;
  }
  glu::CallLogWrapper::glTexParameterf(&_textureMode->super_CallLogWrapper,0x9102,0x813c,1.0);
  NegativeTestContext::expectError(_textureMode,0x502);
LAB_022ba02e:
  NegativeTestContext::endSection(_textureMode);
  glu::CallLogWrapper::glDeleteTextures(&_textureMode->super_CallLogWrapper,1,&local_14);
  return;
}

Assistant:

void texparameterf (NegativeTestContext& ctx)
{
	GLuint texture = 0x1234;
	GLfloat textureMode = -1.0f;
	ctx.glGenTextures(1, &texture);
	ctx.glBindTexture(GL_TEXTURE_2D, texture);

	ctx.beginSection("GL_INVALID_ENUM is generated if target or pname is not one of the accepted defined values.");
	ctx.glTexParameterf(0, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, 0, GL_LINEAR);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(0, 0, GL_LINEAR);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is enum and the value of param(s) is not a valid value.");
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_DEPTH_STENCIL_TEXTURE_MODE, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_MODE, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_FUNC, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_R, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_G, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_B, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_A, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_WRAP_R, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if pname is GL_TEXTURE_BASE_LEVEL or GL_TEXTURE_MAX_LEVEL and param(s) is negative.");
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_BASE_LEVEL, -1.0f);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_MAX_LEVEL, -1.0f);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)))
	{
		ctx.beginSection("GL_INVALID_ENUM is generated if pname is a non-scalar parameter.");
		ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_BORDER_COLOR, 0.0f);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.endSection();
	}

	ctx.beginSection("GL_INVALID_ENUM error is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname is not valid.");
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_BORDER_COLOR, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MIN_FILTER, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MAG_FILTER, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_S, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_T, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_R, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MIN_LOD, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MAX_LOD, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_COMPARE_MODE, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_COMPARE_FUNC, textureMode);
	ctx.expectError(GL_INVALID_ENUM);

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
	{
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_BORDER_COLOR, textureMode);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MIN_FILTER, textureMode);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MAG_FILTER, textureMode);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_WRAP_S, textureMode);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_WRAP_T, textureMode);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_WRAP_R, textureMode);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MIN_LOD, textureMode);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MAX_LOD, textureMode);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_COMPARE_MODE, textureMode);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_COMPARE_FUNC, textureMode);
		ctx.expectError(GL_INVALID_ENUM);
	}
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname GL_TEXTURE_BASE_LEVEL is not 0.");
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_BASE_LEVEL, 1.0f);
	ctx.expectError(GL_INVALID_OPERATION);

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
	{
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_BASE_LEVEL, 1.0f);
		ctx.expectError(GL_INVALID_OPERATION);
	}
	ctx.endSection();

	ctx.glDeleteTextures(1, &texture);
}